

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageFactory::GetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  LogMessage *pLVar1;
  FileDescriptor *pFVar2;
  DescriptorPool *pDVar3;
  DescriptorPool *pDVar4;
  second_type pDVar5;
  LogMessage *other;
  Descriptor *in_RSI;
  Message *result;
  WriterMutexLock lock;
  DescriptorTable *registration_data;
  Message *result_1;
  ReaderMutexLock lock_1;
  LogMessage *in_stack_fffffffffffffeb8;
  LogMessage *in_stack_fffffffffffffec0;
  unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  *in_stack_fffffffffffffec8;
  LogMessage *in_stack_fffffffffffffed0;
  LogMessage *local_98;
  LogMessage *local_8;
  
  internal::MutexLock::MutexLock
            ((MutexLock *)in_stack_fffffffffffffec0,(Mutex *)in_stack_fffffffffffffeb8);
  pLVar1 = (LogMessage *)
           FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                     (in_stack_fffffffffffffec8,(first_type *)in_stack_fffffffffffffec0);
  if (pLVar1 != (LogMessage *)0x0) {
    local_8 = pLVar1;
  }
  internal::MutexLock::~MutexLock((MutexLock *)0x44a985);
  if (pLVar1 == (LogMessage *)0x0) {
    pFVar2 = Descriptor::file(in_RSI);
    pDVar3 = FileDescriptor::pool(pFVar2);
    pDVar4 = DescriptorPool::generated_pool();
    if (pDVar3 == pDVar4) {
      pFVar2 = Descriptor::file(in_RSI);
      FileDescriptor::name_abi_cxx11_(pFVar2);
      std::__cxx11::string::c_str();
      pDVar5 = FindPtrOrNull<std::unordered_map<char_const*,google::protobuf::internal::DescriptorTable_const*,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::internal::DescriptorTable_const*>>>>
                         ((unordered_map<const_char_*,_const_google::protobuf::internal::DescriptorTable_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::internal::DescriptorTable_*>_>_>
                           *)in_stack_fffffffffffffec8,(first_type *)in_stack_fffffffffffffec0);
      if (pDVar5 == (second_type)0x0) {
        internal::LogMessage::LogMessage
                  (in_stack_fffffffffffffed0,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                  );
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        pFVar2 = Descriptor::file(in_RSI);
        FileDescriptor::name_abi_cxx11_(pFVar2);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8);
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        internal::LogMessage::~LogMessage((LogMessage *)0x44aac7);
        local_8 = (LogMessage *)0x0;
      }
      else {
        internal::MutexLock::MutexLock
                  ((MutexLock *)in_stack_fffffffffffffec0,(Mutex *)in_stack_fffffffffffffeb8);
        local_98 = (LogMessage *)
                   FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                             (in_stack_fffffffffffffec8,(first_type *)in_stack_fffffffffffffec0);
        if (local_98 == (LogMessage *)0x0) {
          internal::RegisterFileLevelMetadata((DescriptorTable *)0x44ab56);
          in_stack_fffffffffffffed0 =
               (LogMessage *)
               FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                         (in_stack_fffffffffffffec8,(first_type *)in_stack_fffffffffffffec0);
          local_98 = in_stack_fffffffffffffed0;
        }
        if (local_98 == (LogMessage *)0x0) {
          internal::LogMessage::LogMessage
                    (in_stack_fffffffffffffed0,
                     (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                     (char *)in_stack_fffffffffffffec0,
                     (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
          pLVar1 = internal::LogMessage::operator<<
                             (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
          Descriptor::full_name_abi_cxx11_(in_RSI);
          other = internal::LogMessage::operator<<(pLVar1,(string *)in_stack_fffffffffffffeb8);
          internal::LogFinisher::operator=((LogFinisher *)pLVar1,other);
          internal::LogMessage::~LogMessage((LogMessage *)0x44ac33);
        }
        local_8 = local_98;
        internal::MutexLock::~MutexLock((MutexLock *)0x44ac7d);
      }
    }
    else {
      local_8 = (LogMessage *)0x0;
    }
  }
  return (Message *)local_8;
}

Assistant:

const Message* GeneratedMessageFactory::GetPrototype(const Descriptor* type) {
  {
    ReaderMutexLock lock(&mutex_);
    const Message* result = FindPtrOrNull(type_map_, type);
    if (result != NULL) return result;
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return NULL;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  const internal::DescriptorTable* registration_data =
      FindPtrOrNull(file_map_, type->file()->name().c_str());
  if (registration_data == NULL) {
    GOOGLE_LOG(DFATAL) << "File appears to be in generated pool but wasn't "
                   "registered: "
                << type->file()->name();
    return NULL;
  }

  WriterMutexLock lock(&mutex_);

  // Check if another thread preempted us.
  const Message* result = FindPtrOrNull(type_map_, type);
  if (result == NULL) {
    // Nope.  OK, register everything.
    internal::RegisterFileLevelMetadata(registration_data);
    // Should be here now.
    result = FindPtrOrNull(type_map_, type);
  }

  if (result == NULL) {
    GOOGLE_LOG(DFATAL) << "Type appears to be in generated pool but wasn't "
                << "registered: " << type->full_name();
  }

  return result;
}